

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O0

leb__HeapArgs *
leb__CreateHeapArgs(leb__HeapArgs *__return_storage_ptr__,leb_Heap *leb,leb_Node node,
                   int32_t bitCount)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t lebBufferIndexMSB;
  uint32_t lebBufferIndexLSB;
  uint32_t maxBufferIndex;
  uint32_t alignedBitOffset;
  int32_t bitCount_local;
  leb_Heap *leb_local;
  leb_Node node_local;
  
  uVar1 = leb__NodeBitID(leb,node);
  uVar2 = leb__HeapUint32Size(leb->maxDepth);
  uVar2 = leb__MinValue((uVar1 >> 5) + 1,uVar2 - 1);
  __return_storage_ptr__->bitOffsetLSB = uVar1 & 0x1f;
  uVar3 = leb__MinValue(0x20 - __return_storage_ptr__->bitOffsetLSB,bitCount);
  __return_storage_ptr__->bitCountLSB = uVar3;
  __return_storage_ptr__->bitCountMSB = bitCount - __return_storage_ptr__->bitCountLSB;
  __return_storage_ptr__->bitFieldLSB = leb->buffer + (uVar1 >> 5);
  __return_storage_ptr__->bitFieldMSB = leb->buffer + uVar2;
  return __return_storage_ptr__;
}

Assistant:

leb__HeapArgs
leb__CreateHeapArgs(const leb_Heap *leb, const leb_Node node, int32_t bitCount)
{
    uint32_t alignedBitOffset = leb__NodeBitID(leb, node);
    uint32_t maxBufferIndex = leb__HeapUint32Size(leb->maxDepth) - 1u;
    uint32_t lebBufferIndexLSB = (alignedBitOffset >> 5u);
    uint32_t lebBufferIndexMSB = leb__MinValue(lebBufferIndexLSB + 1, maxBufferIndex);
    leb__HeapArgs args;

    args.bitOffsetLSB = alignedBitOffset & 31u;
    args.bitCountLSB = leb__MinValue(32u - args.bitOffsetLSB, bitCount);
    args.bitCountMSB = bitCount - args.bitCountLSB;
    args.bitFieldLSB = &leb->buffer[lebBufferIndexLSB];
    args.bitFieldMSB = &leb->buffer[lebBufferIndexMSB];

    return args;
}